

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libunicode.c
# Opt level: O0

int cr_realloc(CharRange *cr,int size)

{
  int iVar1;
  long lVar2;
  int in_ESI;
  long in_RDI;
  uint32_t *new_buf;
  int new_size;
  
  if (*(int *)(in_RDI + 4) < in_ESI) {
    iVar1 = max_int(in_ESI,(*(int *)(in_RDI + 4) * 3) / 2);
    lVar2 = (**(code **)(in_RDI + 0x18))
                      (*(undefined8 *)(in_RDI + 0x10),*(undefined8 *)(in_RDI + 8),(long)iVar1 << 2);
    if (lVar2 == 0) {
      return -1;
    }
    *(long *)(in_RDI + 8) = lVar2;
    *(int *)(in_RDI + 4) = iVar1;
  }
  return 0;
}

Assistant:

int cr_realloc(CharRange *cr, int size)
{
    int new_size;
    uint32_t *new_buf;
    
    if (size > cr->size) {
        new_size = max_int(size, cr->size * 3 / 2);
        new_buf = cr->realloc_func(cr->mem_opaque, cr->points,
                                   new_size * sizeof(cr->points[0]));
        if (!new_buf)
            return -1;
        cr->points = new_buf;
        cr->size = new_size;
    }
    return 0;
}